

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtwister.c
# Opt level: O2

void m_seedRand(MTRand *rand,unsigned_long seed)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = seed & 0xffffffff;
  rand->mt[0] = uVar1;
  for (lVar2 = 1; lVar2 != 0x270; lVar2 = lVar2 + 1) {
    uVar1 = (ulong)(uint)((int)uVar1 * 0x17b5);
    rand->mt[lVar2] = uVar1;
  }
  rand->index = 0x270;
  return;
}

Assistant:

inline static void m_seedRand(MTRand* rand, unsigned long seed) {
  /* set initial seeds to mt[STATE_VECTOR_LENGTH] using the generator
   * from Line 25 of Table 1 in: Donald Knuth, "The Art of Computer
   * Programming," Vol. 2 (2nd Ed.) pp.102.
   */
  rand->mt[0] = seed & 0xffffffff;
  for(rand->index=1; rand->index<STATE_VECTOR_LENGTH; rand->index++) {
    rand->mt[rand->index] = (6069 * rand->mt[rand->index-1]) & 0xffffffff;
  }
}